

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

message_frame * lsvm::object::new_message_frame(block *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bytecode_op_t *pbVar3;
  message_frame *pmVar4;
  uint uVar5;
  
  pmVar4 = (message_frame *)
           memory::allocate((ulong)(b->v_temp + b->v_args + b->v_copy + 1) * 0x10 + 0x20);
  pmVar4->next = (message_frame_t *)0x0;
  pmVar4->b = b;
  pmVar4->op = b->op;
  pmVar4[1].next = system::Nil;
  uVar1 = b->v_copy;
  uVar5 = uVar1 - 1;
  if (-1 < (int)uVar5) {
    do {
      uVar2 = b->v_args;
      pbVar3 = (&b[1].op)[(ulong)uVar5 * 2];
      (&pmVar4[1].next)[(ulong)(uVar2 + uVar1) * 2] =
           *(message_frame_t **)(&b[1].on_frame + (ulong)uVar5 * 0x10);
      (&pmVar4[1].next + (ulong)(uVar2 + uVar1) * 2)[1] = (message_frame_t *)pbVar3;
    } while( true );
  }
  return pmVar4;
}

Assistant:

message_frame* new_message_frame(block* b){
    message_frame* m = (message_frame*)lsvm::memory::allocate(
            sizeof(message_frame)+
            ((1+b->v_args+b->v_copy+b->v_temp)*sizeof(variable))
            );
    m->next = null;
    m->b = b;
    m->op = b->op;
    set_nil(&arg(0));
    // copy block enviroment variables
    int32_t i = b->v_copy-1;
    while(i >= 0){
        arg(1+b->v_args+i) = b->v[i]; 
    }    
    return m;
}